

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O1

Wrench * __thiscall iDynTree::SpatialInertia::biasWrench(SpatialInertia *this,Twist *V)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Wrench *ret;
  Wrench *in_RDI;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.
  super_Vector3.m_data[1] = 0.0;
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.
  super_Vector3.m_data[2] = 0.0;
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
  super_Vector3.m_data[2] = 0.0;
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.
  super_Vector3.m_data[0] = 0.0;
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
  super_Vector3.m_data[0] = 0.0;
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
  super_Vector3.m_data[1] = 0.0;
  (in_RDI->super_SpatialForceVector)._vptr_SpatialForceVector =
       (_func_int **)&PTR__SpatialForceVector_0015fc30;
  dVar13 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
           linearVec3.super_Vector3.m_data[0];
  dVar10 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
           angularVec3.super_Vector3.m_data[0];
  dVar1 = this->m_mass;
  dVar2 = this->m_mcom[2];
  dVar3 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
          angularVec3.super_Vector3.m_data[1];
  dVar4 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
          angularVec3.super_Vector3.m_data[2];
  dVar5 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
          linearVec3.super_Vector3.m_data[1];
  dVar6 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
          linearVec3.super_Vector3.m_data[2];
  dVar11 = dVar6 * dVar3 - dVar5 * dVar4;
  dVar12 = dVar13 * dVar4 - dVar6 * dVar10;
  dVar9 = dVar10 * dVar5 - dVar13 * dVar3;
  dVar5 = this->m_mcom[0];
  dVar6 = this->m_mcom[1];
  dVar13 = dVar2 * dVar10 - dVar4 * dVar5;
  dVar7 = this->m_mcom[1];
  dVar8 = this->m_mcom[2];
  dVar14 = dVar5 * dVar3 - dVar10 * dVar7;
  dVar15 = dVar6 * dVar4 - dVar3 * dVar8;
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
  super_Vector3.m_data[0] = dVar1 * dVar11 - (dVar3 * dVar14 - dVar13 * dVar4);
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
  super_Vector3.m_data[1] = dVar1 * dVar12 - (dVar4 * dVar15 - dVar14 * dVar10);
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
  super_Vector3.m_data[2] = dVar1 * dVar9 - (dVar10 * dVar13 - dVar15 * dVar3);
  dVar10 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
           angularVec3.super_Vector3.m_data[0];
  dVar1 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
          angularVec3.super_Vector3.m_data[1];
  dVar14 = (this->m_rotInertia).super_Matrix3x3.m_data[5] * dVar4 +
           (this->m_rotInertia).super_Matrix3x3.m_data[4] * dVar1 +
           (this->m_rotInertia).super_Matrix3x3.m_data[3] * dVar10;
  dVar13 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
           angularVec3.super_Vector3.m_data[0];
  dVar15 = (this->m_rotInertia).super_Matrix3x3.m_data[8] * dVar4 +
           (this->m_rotInertia).super_Matrix3x3.m_data[7] * dVar1 +
           (this->m_rotInertia).super_Matrix3x3.m_data[6] * dVar10;
  dVar10 = (this->m_rotInertia).super_Matrix3x3.m_data[2] * dVar4 +
           (this->m_rotInertia).super_Matrix3x3.m_data[1] * dVar1 +
           (this->m_rotInertia).super_Matrix3x3.m_data[0] * dVar10;
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.
  super_Vector3.m_data[0] = (dVar3 * dVar15 - dVar4 * dVar14) + dVar9 * dVar6 + -dVar8 * dVar12;
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.
  super_Vector3.m_data[1] = (dVar4 * dVar10 - dVar13 * dVar15) + dVar2 * dVar11 + -dVar5 * dVar9;
  (in_RDI->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.
  super_Vector3.m_data[2] = (dVar14 * dVar13 - dVar10 * dVar3) + dVar12 * dVar5 + -dVar7 * dVar11;
  return in_RDI;
}

Assistant:

Wrench SpatialInertia::biasWrench(const Twist& V) const
{
    Wrench ret;

    Eigen::Map<Eigen::Vector3d> linearBiasForce(ret.getLinearVec3().data());
    Eigen::Map<Eigen::Vector3d> angularBiasForce(ret.getAngularVec3().data());

    Eigen::Map<const Eigen::Vector3d> linearVel(V.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> angularVel(V.getAngularVec3().data());

    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > I(this->m_rotInertia.data());

    linearBiasForce = this->m_mass*(angularVel.cross(linearVel)) - angularVel.cross(mcom.cross(angularVel));
    angularBiasForce = mcom.cross(angularVel.cross(linearVel)) + angularVel.cross(I*angularVel);

    return ret;
}